

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntryStream.cpp
# Opt level: O3

Range __thiscall binlog::IstreamEntryStream::nextEntryPayload(IstreamEntryStream *this)

{
  istream *piVar1;
  pointer pcVar2;
  runtime_error *prVar3;
  long *plVar4;
  size_type *psVar5;
  pointer pcVar6;
  Range RVar7;
  uint32_t size;
  uint local_c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::istream::read((char *)this->_input,(long)&local_c4);
  piVar1 = this->_input;
  if (*(FILE **)(piVar1 + 8) == (FILE *)0x0) {
    pcVar2 = (pointer)0x0;
    pcVar6 = (pointer)0x0;
  }
  else {
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
      rewind(this,*(FILE **)(piVar1 + 8));
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_a0,*(long *)(this->_input + 8));
      std::operator+(&local_60,"Failed to read entry size from istream, only got ",&local_a0);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
      local_c0._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_c0._M_dataplus._M_p == psVar5) {
        local_c0.field_2._M_allocated_capacity = *psVar5;
        local_c0.field_2._8_8_ = plVar4[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar5;
      }
      local_c0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::to_string(&local_80,4);
      std::operator+(&local_40,&local_c0,&local_80);
      std::runtime_error::runtime_error(prVar3,(string *)&local_40);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<char,_std::allocator<char>_>::resize(&this->_buffer,(ulong)local_c4);
    std::istream::read((char *)this->_input,
                       (long)(this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_start);
    piVar1 = this->_input;
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
      rewind(this,(FILE *)(*(long *)(piVar1 + 8) + 4));
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_a0,*(long *)(this->_input + 8));
      std::operator+(&local_60,"Failed to read entry payload from istream, only got ",&local_a0);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
      local_c0._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_c0._M_dataplus._M_p == psVar5) {
        local_c0.field_2._M_allocated_capacity = *psVar5;
        local_c0.field_2._8_8_ = plVar4[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar5;
      }
      local_c0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::to_string(&local_80,local_c4);
      std::operator+(&local_40,&local_c0,&local_80);
      std::runtime_error::runtime_error(prVar3,(string *)&local_40);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = (this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar6 = (this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  RVar7._end = pcVar6;
  RVar7._begin = pcVar2;
  return RVar7;
}

Assistant:

Range IstreamEntryStream::nextEntryPayload()
{
  std::uint32_t size;
  _input.read(reinterpret_cast<char*>(&size), sizeof(size));
  if (_input.gcount() == 0)
  {
    return {}; // eof
  }

  if (! _input) // found some bytes, but not enough
  {
    rewind(_input.gcount());
    throw std::runtime_error("Failed to read entry size from istream, only got "
      + std::to_string(_input.gcount()) + " bytes, expected " + std::to_string(sizeof(size)));
  }

  // TODO(benedek) protect agains bad alloc by limiting size?
  _buffer.resize(size);
  _input.read(_buffer.data(), std::streamsize(size));
  if (! _input) // payload is truncated
  {
    rewind(std::streamsize(sizeof(size)) + _input.gcount());
    throw std::runtime_error("Failed to read entry payload from istream, only got "
      + std::to_string(_input.gcount()) + " bytes, expected " + std::to_string(size));
  }

  return Range{_buffer.data(), _buffer.size()};
}